

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool EvalChecksig(valtype *sig,valtype *pubkey,const_iterator pbegincodehash,const_iterator pend,
                 ScriptExecutionData *execdata,uint flags,BaseSignatureChecker *checker,
                 SigVersion sigversion,ScriptError *serror,bool *success)

{
  long lVar1;
  const_iterator pend_00;
  bool bVar2;
  valtype *in_RCX;
  valtype *in_RDX;
  ScriptExecutionData *in_RSI;
  valtype *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  uint in_stack_00000010;
  undefined4 in_stack_00000014;
  const_iterator in_stack_00000018;
  SigVersion in_stack_00000070;
  ScriptError *in_stack_00000078;
  SigVersion in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_stack_00000010 < 2) {
    pend_00.ptr._4_4_ = in_stack_00000014;
    pend_00.ptr._0_4_ = in_stack_00000010;
    bVar2 = EvalChecksigPreTapscript
                      (in_RDX,in_RCX,in_stack_00000018,pend_00,in_stack_ffffffffffffffd4,
                       (BaseSignatureChecker *)in_RDI,in_stack_00000070,in_stack_00000078,
                       (bool *)checker);
  }
  else {
    if ((in_stack_00000010 == 2) || (in_stack_00000010 != 3)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                    ,0x193,
                    "bool EvalChecksig(const valtype &, const valtype &, CScript::const_iterator, CScript::const_iterator, ScriptExecutionData &, unsigned int, const BaseSignatureChecker &, SigVersion, ScriptError *, bool &)"
                   );
    }
    bVar2 = EvalChecksigTapscript
                      ((valtype *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_RDI,in_RSI,(uint)((ulong)in_R8 >> 0x20),
                       (BaseSignatureChecker *)CONCAT44(in_R9D,3),in_stack_ffffffffffffffac,
                       (ScriptError *)CONCAT44(in_stack_00000014,3),(bool *)in_stack_00000018.ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

static bool EvalChecksig(const valtype& sig, const valtype& pubkey, CScript::const_iterator pbegincodehash, CScript::const_iterator pend, ScriptExecutionData& execdata, unsigned int flags, const BaseSignatureChecker& checker, SigVersion sigversion, ScriptError* serror, bool& success)
{
    switch (sigversion) {
    case SigVersion::BASE:
    case SigVersion::WITNESS_V0:
        return EvalChecksigPreTapscript(sig, pubkey, pbegincodehash, pend, flags, checker, sigversion, serror, success);
    case SigVersion::TAPSCRIPT:
        return EvalChecksigTapscript(sig, pubkey, execdata, flags, checker, sigversion, serror, success);
    case SigVersion::TAPROOT:
        // Key path spending in Taproot has no script, so this is unreachable.
        break;
    }
    assert(false);
}